

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cpp
# Opt level: O0

char * asmjit::DebugUtils::errorAsString(Error err)

{
  uint *puVar1;
  uint32_t i;
  uint local_18;
  uint local_14;
  uint local_10;
  char *local_8;
  
  local_18 = 0x38;
  puVar1 = std::min<unsigned_int>(&local_14,&local_18);
  local_8 = "Ok";
  for (local_10 = 0; local_10 < *puVar1; local_10 = local_10 + 1) {
    for (; *local_8 != '\0'; local_8 = local_8 + 1) {
    }
    local_8 = local_8 + 1;
  }
  return local_8;
}

Assistant:

ASMJIT_FAVOR_SIZE const char* DebugUtils::errorAsString(Error err) noexcept {
#if !defined(ASMJIT_DISABLE_TEXT)
  return Utils::findPackedString(errorMessages, std::min<Error>(err, kErrorCount));
#else
  static const char noMessage[] = "";
  return noMessage;
#endif
}